

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O1

bool __thiscall ELFIO::elfio::load_segments(elfio *this,istream *stream,bool is_lazy)

{
  pointer puVar1;
  segment *psVar2;
  elfio *peVar3;
  pointer puVar4;
  section sVar5;
  pointer puVar6;
  istream *piVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar12;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_> *psec;
  pointer puVar13;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  ushort local_8e;
  byte local_8b;
  ushort local_8a;
  segment_impl<ELFIO::Elf64_Phdr> *local_88;
  uint local_7c;
  address_translator *local_78;
  endianness_convertor *local_70;
  vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
  *local_68;
  ulong local_60;
  ulong local_58;
  istream *local_50;
  elfio *local_48;
  ulong local_40;
  long local_38;
  undefined4 extraout_var_04;
  
  uVar8 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[4])()
  ;
  uVar9 = (*((this->header)._M_t.
             super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
             super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
             super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header[9])()
  ;
  iVar10 = (*((this->header)._M_t.
              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t
              .super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
              super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
             [0x1c])();
  iVar11 = (*((this->header)._M_t.
              super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t
              .super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
              super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl)->_vptr_elf_header
             [0x1e])();
  local_38 = CONCAT44(extraout_var,iVar11);
  local_8a = (ushort)iVar10;
  local_8b = (byte)uVar8;
  if ((((ushort)uVar9 < 0x38 && local_8b == 2) && local_8a != 0) ||
     (local_40 = (ulong)(uVar9 & 0xffff), ((ushort)uVar9 < 0x20 && local_8b == 1) && local_8a != 0))
  {
    bVar16 = false;
  }
  else {
    local_8e = 0;
    bVar16 = local_8a == 0;
    if (!bVar16) {
      local_68 = (vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
                  *)&this->segments_;
      local_70 = &this->convertor;
      local_78 = &this->addr_translator;
      local_7c = (uint)is_lazy;
      local_50 = stream;
      local_48 = this;
      do {
        peVar3 = local_48;
        piVar7 = local_50;
        if ((char)uVar8 == '\x02') {
          local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)
                     operator_new(0x90,(nothrow_t *)&std::nothrow);
          if (local_88 == (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
            local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)0x0;
          }
          else {
            (local_88->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_00121100;
            local_88->pstream = (istream *)0x0;
            (local_88->ph).p_type = 0;
            (local_88->ph).p_flags = 0;
            (local_88->ph).p_offset = 0;
            (local_88->ph).p_vaddr = 0;
            (local_88->ph).p_paddr = 0;
            (local_88->ph).p_filesz = 0;
            (local_88->ph).p_memsz = 0;
            (local_88->ph).p_align = 0;
            local_88->index = 0;
            (local_88->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_88->convertor = local_70;
            local_88->translator = local_78;
            local_88->stream_size = 0;
            *(undefined4 *)((long)&local_88->stream_size + 7) = 0;
          }
          std::
          vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
          ::emplace_back<ELFIO::segment_impl<ELFIO::Elf64_Phdr>*>(local_68,&local_88);
        }
        else {
          if ((char)uVar8 != '\x01') goto LAB_0010fc53;
          local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)
                     operator_new(0x78,(nothrow_t *)&std::nothrow);
          if (local_88 == (segment_impl<ELFIO::Elf64_Phdr> *)0x0) {
            local_88 = (segment_impl<ELFIO::Elf64_Phdr> *)0x0;
          }
          else {
            (local_88->super_segment)._vptr_segment = (_func_int **)&PTR__segment_impl_00121228;
            local_88->pstream = (istream *)0x0;
            (local_88->ph).p_type = 0;
            (local_88->ph).p_flags = 0;
            (local_88->ph).p_offset = 0;
            (local_88->ph).p_vaddr = 0;
            *(undefined8 *)((long)&(local_88->ph).p_vaddr + 2) = 0;
            *(undefined8 *)((long)&(local_88->ph).p_paddr + 2) = 0;
            (local_88->ph).p_memsz = 0;
            (local_88->ph).p_align = 0;
            *(undefined8 *)&local_88->index = 0;
            (local_88->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = (char *)0x0;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_70;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_78;
            (local_88->sections).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(undefined4 *)
             ((long)&(local_88->sections).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7) = 0;
          }
          std::
          vector<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>,std::allocator<std::unique_ptr<ELFIO::segment,std::default_delete<ELFIO::segment>>>>
          ::emplace_back<ELFIO::segment_impl<ELFIO::Elf32_Phdr>*>
                    (local_68,(segment_impl<ELFIO::Elf32_Phdr> **)&local_88);
        }
        psVar2 = (peVar3->segments_).
                 super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                 super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
                 super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                 super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
        iVar10 = (*psVar2->_vptr_segment[0x1c])
                           (psVar2,piVar7,local_8e * local_40 + local_38,0,(ulong)local_7c);
        if (((char)iVar10 == '\0') ||
           (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0)) {
LAB_0010fc53:
          puVar6 = (peVar3->segments_).
                   super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar1 = puVar6 + -1;
          (peVar3->segments_).
          super__Vector_base<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>,_std::allocator<std::unique_ptr<ELFIO::segment,_std::default_delete<ELFIO::segment>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = puVar1;
          psVar2 = puVar6[-1]._M_t.
                   super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>._M_t.
                   super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
                   super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl;
          if (psVar2 != (segment *)0x0) {
            (*psVar2->_vptr_segment[1])();
          }
          (puVar1->_M_t).super___uniq_ptr_impl<ELFIO::segment,_std::default_delete<ELFIO::segment>_>
          ._M_t.super__Tuple_impl<0UL,_ELFIO::segment_*,_std::default_delete<ELFIO::segment>_>.
          super__Head_base<0UL,_ELFIO::segment_*,_false>._M_head_impl = (segment *)0x0;
          return bVar16;
        }
        (*psVar2->_vptr_segment[0x1a])(psVar2,&local_8e);
        iVar10 = (*psVar2->_vptr_segment[0x11])(psVar2);
        local_58 = CONCAT44(extraout_var_00,iVar10);
        iVar10 = (*psVar2->_vptr_segment[0xd])(psVar2);
        iVar11 = (*psVar2->_vptr_segment[9])(psVar2);
        local_60 = CONCAT44(extraout_var_02,iVar11);
        iVar11 = (*psVar2->_vptr_segment[0xf])(psVar2);
        peVar3 = (peVar3->sections).parent;
        puVar13 = (peVar3->sections_).
                  super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (peVar3->sections_).
                 super__Vector_base<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>,_std::allocator<std::unique_ptr<ELFIO::section,_std::default_delete<ELFIO::section>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar13 != puVar4) {
          uVar15 = CONCAT44(extraout_var_01,iVar10) + local_58;
          uVar14 = CONCAT44(extraout_var_03,iVar11) + local_60;
          do {
            uVar8 = (*((puVar13->_M_t).
                       super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                       .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section
                      [7])();
            sVar5._vptr_section =
                 ((puVar13->_M_t).
                  super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>._M_t.
                  super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>.
                  super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->_vptr_section;
            if ((uVar8 & 2) == 0) {
              iVar10 = (*sVar5._vptr_section[0x17])();
              uVar12 = CONCAT44(extraout_var_04,iVar10);
              iVar10 = (*((puVar13->_M_t).
                          super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                          .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                         _vptr_section[0x13])();
              if (((uVar12 < uVar15) && (local_58 <= uVar12)) &&
                 (CONCAT44(extraout_var_05,iVar10) + uVar12 <= uVar15)) {
LAB_0010fbbd:
                iVar10 = (*psVar2->_vptr_segment[3])(psVar2);
                if (((iVar10 != 7) ||
                    (uVar8 = (*((puVar13->_M_t).
                                super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                               _vptr_section[7])(), (uVar8 >> 10 & 1) != 0)) &&
                   ((uVar8 = (*((puVar13->_M_t).
                                super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                                .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                               _vptr_section[7])(), (uVar8 >> 10 & 1) == 0 ||
                    (iVar10 = (*psVar2->_vptr_segment[3])(psVar2), iVar10 == 7)))) {
                  uVar8 = (*((puVar13->_M_t).
                             super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                             .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                            _vptr_section[2])();
                  (*psVar2->_vptr_segment[0x15])(psVar2,(ulong)(uVar8 & 0xffff),0);
                }
              }
            }
            else {
              iVar10 = (*sVar5._vptr_section[0x11])();
              uVar12 = CONCAT44(extraout_var_06,iVar10);
              iVar10 = (*((puVar13->_M_t).
                          super___uniq_ptr_impl<ELFIO::section,_std::default_delete<ELFIO::section>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ELFIO::section_*,_std::default_delete<ELFIO::section>_>
                          .super__Head_base<0UL,_ELFIO::section_*,_false>._M_head_impl)->
                         _vptr_section[0x13])();
              if (((uVar12 < uVar14) && (local_60 <= uVar12)) &&
                 (CONCAT44(extraout_var_07,iVar10) + uVar12 <= uVar14)) goto LAB_0010fbbd;
            }
            puVar13 = puVar13 + 1;
          } while (puVar13 != puVar4);
        }
        local_8e = local_8e + 1;
        bVar16 = local_8e >= local_8a;
        uVar8 = (uint)local_8b;
      } while (local_8e < local_8a);
    }
  }
  return bVar16;
}

Assistant:

bool load_segments( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_segment_entry_size();
        Elf_Half      num        = header->get_segments_num();
        Elf64_Off     offset     = header->get_segments_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Phdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Phdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            if ( file_class == ELFCLASS64 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf64_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else if ( file_class == ELFCLASS32 ) {
                segments_.emplace_back(
                    new ( std::nothrow ) segment_impl<Elf32_Phdr>(
                        &convertor, &addr_translator ) );
            }
            else {
                segments_.pop_back();
                return false;
            }

            segment* seg = segments_.back().get();

            if ( !seg->load( stream,
                             static_cast<std::streamoff>( offset ) +
                                 static_cast<std::streampos>( i ) * entry_size,
                             is_lazy ) ||
                 stream.fail() ) {
                segments_.pop_back();
                return false;
            }

            seg->set_index( i );

            // Add sections to the segments (similar to readelfs algorithm)
            Elf64_Off segBaseOffset = seg->get_offset();
            Elf64_Off segEndOffset  = segBaseOffset + seg->get_file_size();
            Elf64_Off segVBaseAddr  = seg->get_virtual_address();
            Elf64_Off segVEndAddr   = segVBaseAddr + seg->get_memory_size();
            for ( const auto& psec : sections ) {
                // SHF_ALLOC sections are matched based on the virtual address
                // otherwise the file offset is matched
                if ( ( ( psec->get_flags() & SHF_ALLOC ) == SHF_ALLOC )
                         ? is_sect_in_seg( psec->get_address(),
                                           psec->get_size(), segVBaseAddr,
                                           segVEndAddr )
                         : is_sect_in_seg( psec->get_offset(), psec->get_size(),
                                           segBaseOffset, segEndOffset ) ) {

                    // If it is a TLS segment, add TLS sections only and vice versa
                    if ( ( ( seg->get_type() == PT_TLS ) &&
                           ( ( psec->get_flags() & SHF_TLS ) != SHF_TLS ) ) ||
                         ( ( ( psec->get_flags() & SHF_TLS ) == SHF_TLS ) &&
                           ( seg->get_type() != PT_TLS ) ) )
                        continue;

                    // Alignment of segment shall not be updated, to preserve original value
                    // It will be re-calculated on saving.
                    seg->add_section_index( psec->get_index(), 0 );
                }
            }
        }

        return true;
    }